

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gepard-bounding-box.cpp
# Opt level: O0

void __thiscall gepard::BoundingBox::stretch(BoundingBox *this,FloatPoint *p)

{
  FloatPoint *p_local;
  BoundingBox *this_local;
  
  stretchX(this,p->x);
  stretchY(this,p->y);
  return;
}

Assistant:

void BoundingBox::stretch(const FloatPoint& p)
{
    stretchX(p.x);
    stretchY(p.y);
}